

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  
  pbVar2 = s->img_buffer;
  pbVar5 = s->img_buffer_end;
  if (pbVar2 < pbVar5) {
LAB_0015e4ad:
    pbVar2 = pbVar2 + 1;
    s->img_buffer = pbVar2;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    pbVar2 = s->img_buffer;
    pbVar5 = s->img_buffer_end;
    goto LAB_0015e4ad;
  }
  if (pbVar2 < pbVar5) {
LAB_0015e4d5:
    s->img_buffer = pbVar2 + 1;
    if (1 < *pbVar2) goto LAB_0015e7a4;
    pbVar5 = s->img_buffer_end;
    bVar9 = *pbVar2 == 0;
    pbVar2 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      goto LAB_0015e4d5;
    }
    bVar9 = true;
  }
  if (pbVar2 < pbVar5) {
LAB_0015e520:
    s->img_buffer = pbVar2 + 1;
    bVar7 = *pbVar2;
    pbVar2 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      goto LAB_0015e520;
    }
    bVar7 = 0;
  }
  if (bVar9) {
    if ((bVar7 & 0xf6) != 2) goto LAB_0015e7a4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0015e5ce:
      s->img_buffer = pbVar2 + 9;
    }
    else {
      iVar3 = (int)s->img_buffer_end - (int)pbVar2;
      if (8 < iVar3) goto LAB_0015e5ce;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,9 - iVar3);
    }
    bVar6 = 0;
  }
  else {
    if ((bVar7 & 0xf7) != 1) goto LAB_0015e7a4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0015e5e1:
      pbVar2 = pbVar2 + 4;
      s->img_buffer = pbVar2;
    }
    else {
      iVar3 = (int)s->img_buffer_end - (int)pbVar2;
      if (3 < iVar3) goto LAB_0015e5e1;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar3);
      pbVar2 = s->img_buffer;
    }
    if (s->img_buffer_end <= pbVar2) {
      if (s->read_from_callbacks == 0) goto LAB_0015e7a4;
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
    }
    s->img_buffer = pbVar2 + 1;
    bVar6 = *pbVar2;
    if ((0x20 < (ulong)bVar6) || ((0x101018100U >> ((ulong)bVar6 & 0x3f) & 1) == 0))
    goto LAB_0015e7a4;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0015e679:
      s->img_buffer = pbVar2 + 5;
    }
    else {
      iVar3 = (int)s->img_buffer_end - (int)(pbVar2 + 1);
      if (3 < iVar3) goto LAB_0015e679;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar3);
    }
  }
  iVar3 = stbi__get16le(s);
  if ((iVar3 == 0) || (iVar1 = stbi__get16le(s), iVar1 == 0)) goto LAB_0015e7a4;
  pbVar2 = s->img_buffer;
  pbVar5 = s->img_buffer_end;
  if (pbVar2 < pbVar5) {
LAB_0015e6ea:
    s->img_buffer = pbVar2 + 1;
    bVar8 = *pbVar2;
    pbVar2 = pbVar2 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar2 = s->img_buffer;
      pbVar5 = s->img_buffer_end;
      goto LAB_0015e6ea;
    }
    bVar8 = 0;
  }
  if (pbVar2 < pbVar5) {
LAB_0015e721:
    s->img_buffer = pbVar2 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    pbVar2 = s->img_buffer;
    goto LAB_0015e721;
  }
  if (bVar6 == 0) {
    if (0xf < bVar8) {
      if ((bVar8 == 0x20) || (bVar8 == 0x18)) {
        uVar4 = (uint)(bVar8 >> 3);
      }
      else {
        if (bVar8 != 0x10) goto LAB_0015e7a4;
        uVar4 = (bVar7 & 0xf7) == 3 ^ 3;
      }
      goto LAB_0015e7e3;
    }
LAB_0015e78a:
    uVar4 = 1;
    if (bVar8 == 8) goto LAB_0015e7e3;
    if (bVar8 != 0xf) {
LAB_0015e7a4:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  else {
    if ((bVar8 != 8) && (bVar8 != 0x10)) goto LAB_0015e7a4;
    bVar8 = bVar6;
    if (bVar6 < 0x10) goto LAB_0015e78a;
    if ((bVar6 == 0x20) || (bVar6 == 0x18)) {
      uVar4 = (uint)(bVar6 >> 3);
      goto LAB_0015e7e3;
    }
    if (bVar6 != 0x10) goto LAB_0015e7a4;
  }
  uVar4 = 3;
LAB_0015e7e3:
  if (x != (int *)0x0) {
    *x = iVar3;
  }
  if (y != (int *)0x0) {
    *y = iVar1;
  }
  if (comp == (int *)0x0) {
    return 1;
  }
  *comp = uVar4;
  return 1;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}